

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_gradation_at_complexity_mixed
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  uint uVar1;
  void *__ptr;
  long lVar2;
  double dVar3;
  REF_NODE local_a8;
  double local_98;
  REF_NODE local_90;
  double local_80;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *metric_imply;
  REF_INT i;
  REF_INT node;
  REF_DBL complexity_scale;
  REF_DBL current_complexity;
  REF_NODE pRStack_38;
  REF_INT relaxations;
  REF_NODE ref_node;
  REF_DBL complexity_local;
  REF_DBL gradation_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  pRStack_38 = ref_grid->node;
  ref_node = (REF_NODE)complexity;
  complexity_local = gradation;
  gradation_local = (REF_DBL)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  if (ref_grid->node->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x478,
           "ref_metric_gradation_at_complexity_mixed","malloc metric_imply of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)(ref_grid->node->max * 6) << 3);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x478,"ref_metric_gradation_at_complexity_mixed","malloc metric_imply of REF_DBL NULL")
      ;
      metric_local._4_4_ = 2;
    }
    else {
      _i = 0.6666666666666666;
      if (*(int *)((long)gradation_local + 0x108) != 0) {
        _i = 1.0;
      }
      for (current_complexity._4_4_ = 0; current_complexity._4_4_ < 0x14;
          current_complexity._4_4_ = current_complexity._4_4_ + 1) {
        uVar1 = ref_metric_complexity
                          ((REF_DBL *)ref_grid_local,(REF_GRID)gradation_local,&complexity_scale);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x480,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar1,"cmp");
          return uVar1;
        }
        if (complexity_scale * 1e+20 <= 0.0) {
          local_80 = -(complexity_scale * 1e+20);
        }
        else {
          local_80 = complexity_scale * 1e+20;
        }
        if ((double)ref_node <= 0.0) {
          local_90 = (REF_NODE)((ulong)ref_node ^ 0x8000000000000000);
        }
        else {
          local_90 = ref_node;
        }
        if (local_80 <= (double)local_90) {
          return 4;
        }
        for (metric_imply._4_4_ = 0; metric_imply._4_4_ < pRStack_38->max;
            metric_imply._4_4_ = metric_imply._4_4_ + 1) {
          if (((-1 < metric_imply._4_4_) && (metric_imply._4_4_ < pRStack_38->max)) &&
             (-1 < pRStack_38->global[metric_imply._4_4_])) {
            for (metric_imply._0_4_ = 0; (int)metric_imply < 6;
                metric_imply._0_4_ = (int)metric_imply + 1) {
              dVar3 = pow((double)ref_node / complexity_scale,_i);
              lVar2 = (long)((int)metric_imply + metric_imply._4_4_ * 6);
              ref_grid_local->cell[lVar2 + -2] =
                   (REF_CELL)(dVar3 * (double)ref_grid_local->cell[lVar2 + -2]);
            }
            if (*(int *)((long)gradation_local + 0x108) != 0) {
              ref_grid_local->cell[(long)(metric_imply._4_4_ * 6 + 2) + -2] = (REF_CELL)0x0;
              ref_grid_local->cell[(long)(metric_imply._4_4_ * 6 + 4) + -2] = (REF_CELL)0x0;
              ref_grid_local->cell[(long)(metric_imply._4_4_ * 6 + 5) + -2] =
                   (REF_CELL)0x3ff0000000000000;
            }
          }
        }
        uVar1 = ref_metric_imply_non_tet((REF_DBL *)ref_grid_local,(REF_GRID)gradation_local);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x48f,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar1,"imply non tet");
          return uVar1;
        }
        if (1.0 <= complexity_local) {
          uVar1 = ref_metric_metric_space_gradation
                            ((REF_DBL *)ref_grid_local,(REF_GRID)gradation_local,complexity_local);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x495,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar1,"gradation");
            return uVar1;
          }
        }
        else {
          uVar1 = ref_metric_mixed_space_gradation
                            ((REF_DBL *)ref_grid_local,(REF_GRID)gradation_local,-1.0,-1.0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x492,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar1,"gradation");
            return uVar1;
          }
        }
        if (*(int *)((long)gradation_local + 0x108) != 0) {
          for (metric_imply._4_4_ = 0; metric_imply._4_4_ < pRStack_38->max;
              metric_imply._4_4_ = metric_imply._4_4_ + 1) {
            if (((-1 < metric_imply._4_4_) && (metric_imply._4_4_ < pRStack_38->max)) &&
               (-1 < pRStack_38->global[metric_imply._4_4_])) {
              ref_grid_local->cell[(long)(metric_imply._4_4_ * 6 + 2) + -2] = (REF_CELL)0x0;
              ref_grid_local->cell[(long)(metric_imply._4_4_ * 6 + 4) + -2] = (REF_CELL)0x0;
              ref_grid_local->cell[(long)(metric_imply._4_4_ * 6 + 5) + -2] =
                   (REF_CELL)0x3ff0000000000000;
            }
          }
        }
      }
      uVar1 = ref_metric_complexity
                        ((REF_DBL *)ref_grid_local,(REF_GRID)gradation_local,&complexity_scale);
      if (uVar1 == 0) {
        if (complexity_scale * 1e+20 <= 0.0) {
          local_98 = -(complexity_scale * 1e+20);
        }
        else {
          local_98 = complexity_scale * 1e+20;
        }
        if ((double)ref_node <= 0.0) {
          local_a8 = (REF_NODE)((ulong)ref_node ^ 0x8000000000000000);
        }
        else {
          local_a8 = ref_node;
        }
        if ((double)local_a8 < local_98) {
          for (metric_imply._4_4_ = 0; metric_imply._4_4_ < pRStack_38->max;
              metric_imply._4_4_ = metric_imply._4_4_ + 1) {
            if (((-1 < metric_imply._4_4_) && (metric_imply._4_4_ < pRStack_38->max)) &&
               (-1 < pRStack_38->global[metric_imply._4_4_])) {
              for (metric_imply._0_4_ = 0; (int)metric_imply < 6;
                  metric_imply._0_4_ = (int)metric_imply + 1) {
                dVar3 = pow((double)ref_node / complexity_scale,_i);
                lVar2 = (long)((int)metric_imply + metric_imply._4_4_ * 6);
                ref_grid_local->cell[lVar2 + -2] =
                     (REF_CELL)(dVar3 * (double)ref_grid_local->cell[lVar2 + -2]);
              }
              if (*(int *)((long)gradation_local + 0x108) != 0) {
                ref_grid_local->cell[(long)(metric_imply._4_4_ * 6 + 2) + -2] = (REF_CELL)0x0;
                ref_grid_local->cell[(long)(metric_imply._4_4_ * 6 + 4) + -2] = (REF_CELL)0x0;
                ref_grid_local->cell[(long)(metric_imply._4_4_ * 6 + 5) + -2] =
                     (REF_CELL)0x3ff0000000000000;
              }
            }
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          metric_local._4_4_ = 0;
        }
        else {
          metric_local._4_4_ = 4;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x49f,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar1,"cmp");
        metric_local._4_4_ = uVar1;
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_gradation_at_complexity_mixed(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL gradation, REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;
  REF_DBL *metric_imply;

  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
      if (ref_grid_twod(ref_grid)) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
    RSS(ref_metric_imply_non_tet(metric, ref_grid), "imply non tet");
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
  }
  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  ref_free(metric_imply) return REF_SUCCESS;
}